

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3tokOpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  int iVar1;
  sqlite3_vtab_cursor *psVar2;
  int iVar3;
  
  iVar1 = sqlite3_initialize();
  iVar3 = 7;
  if (iVar1 == 0) {
    psVar2 = (sqlite3_vtab_cursor *)sqlite3Malloc(0x38);
    if (psVar2 != (sqlite3_vtab_cursor *)0x0) {
      psVar2[4].pVtab = (sqlite3_vtab *)0x0;
      psVar2[5].pVtab = (sqlite3_vtab *)0x0;
      psVar2[2].pVtab = (sqlite3_vtab *)0x0;
      psVar2[3].pVtab = (sqlite3_vtab *)0x0;
      psVar2->pVtab = (sqlite3_vtab *)0x0;
      psVar2[1].pVtab = (sqlite3_vtab *)0x0;
      psVar2[6].pVtab = (sqlite3_vtab *)0x0;
      *ppCsr = psVar2;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int fts3tokOpenMethod(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCsr){
  Fts3tokCursor *pCsr;
  UNUSED_PARAMETER(pVTab);

  pCsr = (Fts3tokCursor *)sqlite3_malloc(sizeof(Fts3tokCursor));
  if( pCsr==0 ){
    return SQLITE_NOMEM;
  }
  memset(pCsr, 0, sizeof(Fts3tokCursor));

  *ppCsr = (sqlite3_vtab_cursor *)pCsr;
  return SQLITE_OK;
}